

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_accept.c
# Opt level: O2

int mpt_parse_accept(mpt_parser_allow *flg,char *name)

{
  ushort uVar1;
  int iVar2;
  long lVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  ushort **ppuVar7;
  __int32_t **pp_Var8;
  byte bVar9;
  char cVar10;
  long lStack_40;
  
  if (name == (char *)0x0) {
    flg->sect = 0xff;
    flg->opt = 0xff;
  }
  else {
    cVar10 = *name;
    if (cVar10 != '\0') {
      lStack_40 = 0;
      bVar9 = 0;
      bVar6 = 0;
      while (cVar10 != '\0') {
        ppuVar7 = __ctype_b_loc();
        uVar1 = (*ppuVar7)[cVar10];
        if ((uVar1 >> 0xd & 1) != 0) break;
        pp_Var8 = __ctype_tolower_loc();
        iVar2 = (*pp_Var8)[cVar10];
        switch(iVar2) {
        case 0x62:
          bVar4 = 0x20;
          break;
        case 99:
          bVar4 = 2;
          break;
        case 100:
switchD_00118065_caseD_64:
          lStack_40 = -2;
          goto LAB_001180e0;
        case 0x65:
          bVar4 = 0x10;
          break;
        case 0x66:
          bVar4 = 1;
          break;
        default:
          if (iVar2 == 0x6e) {
            bVar4 = 3;
          }
          else if (iVar2 == 0x73) {
            bVar4 = 4;
          }
          else {
            if (iVar2 != 0x77) goto switchD_00118065_caseD_64;
            bVar4 = 8;
          }
        }
        bVar5 = 0;
        if ((uVar1 >> 8 & 1) == 0) {
          bVar5 = bVar4;
          bVar4 = 0;
        }
        bVar9 = bVar4 | bVar9;
        bVar6 = bVar5 | bVar6;
        lVar3 = lStack_40 + 1;
        lStack_40 = lStack_40 + 1;
        cVar10 = name[lVar3];
      }
      flg->sect = (ushort)bVar9;
      flg->opt = (ushort)bVar6;
      goto LAB_001180e0;
    }
    flg->sect = 2;
    flg->opt = 2;
  }
  lStack_40 = 0;
LAB_001180e0:
  return (int)lStack_40;
}

Assistant:

extern int mpt_parse_accept(MPT_STRUCT(parser_allow) *flg, const char *name)
{
	const char *end = name;
	uint8_t sect = 0, opt = 0;
	
	if (!end) {
		flg->sect = flg->opt = 0xff;
		return 0;
	}
	if (!*end) {
		flg->sect = flg->opt = MPT_NAMEFLAG(NumCont);
		return 0;
	}
	while (*end) {
		int type;
		
		if (isspace(*end)) {
			break;
		}
		switch (type = tolower(*end)) {
		  case 'f': type = MPT_NAMEFLAG(NumStart); break;
		  case 'c': type = MPT_NAMEFLAG(NumCont); break;
		  case 'n': type = MPT_NAMEFLAG(Numeral); break;
		  case 's': type = MPT_NAMEFLAG(Special); break;
		  case 'w': type = MPT_NAMEFLAG(Space); break;
		  
		  case 'e': type = MPT_NAMEFLAG(Empty); break;
		  case 'b': type = MPT_NAMEFLAG(Binary); break;
		  default: return -2;
		}
		if (isupper(*end)) {
			sect |= type;
		} else {
			opt |= type;
		}
		++end;
	}
	flg->sect = sect;
	flg->opt  = opt;
	
	return end - name;
}